

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O0

VkRenderingAttachmentInfoKHR * __thiscall
VulkanUtilities::RenderingInfoWrapper::GetDepthAttachment(RenderingInfoWrapper *this)

{
  Char *Message;
  type pVVar1;
  char (*in_RCX) [66];
  undefined1 local_30 [8];
  string msg;
  RenderingInfoWrapper *this_local;
  
  msg.field_2._8_8_ = this;
  if (((this->m_RI).pDepthAttachment == (VkRenderingAttachmentInfo *)0x0) ||
     (this->m_DepthAttachmentIndex == 0xffffffff)) {
    Diligent::FormatString<char[26],char[66]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_RI.pDepthAttachment != nullptr && m_DepthAttachmentIndex != ~0u",
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"GetDepthAttachment",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x5a);
    std::__cxx11::string::~string((string *)local_30);
  }
  pVVar1 = std::
           unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
           ::operator[](&this->m_Attachments,(ulong)this->m_DepthAttachmentIndex);
  return pVVar1;
}

Assistant:

VkRenderingAttachmentInfoKHR& GetDepthAttachment()
    {
        VERIFY_EXPR(m_RI.pDepthAttachment != nullptr && m_DepthAttachmentIndex != ~0u);
        return m_Attachments[m_DepthAttachmentIndex];
    }